

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HgtFilesGrid.cpp
# Opt level: O1

void __thiscall HgtFilesGrid::Init(HgtFilesGrid *this,int maxLoadedFiles,char *filesPath)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  Heights *pHVar5;
  FILE *__stream;
  ostream *poVar6;
  char *__dest;
  long lVar7;
  int iVar8;
  ulong uVar9;
  FileFlag (*paFVar10) [361];
  string fileName;
  char demFileName [12];
  long *local_80;
  int local_78;
  undefined4 uStack_74;
  long local_70 [2];
  HgtFilesGrid *local_60;
  long local_58;
  char *local_50;
  double local_48;
  allocator<char> local_3c [12];
  
  this->loadedFiles = 0;
  this->MAX_LOADED_FILES = maxLoadedFiles;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)maxLoadedFiles;
  uVar9 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x2c04d0),8) == 0) {
    uVar9 = SUB168(auVar3 * ZEXT816(0x2c04d0),0);
  }
  local_50 = filesPath;
  pHVar5 = (Heights *)operator_new__(uVar9);
  this->dataStack = pHVar5;
  if (0 < maxLoadedFiles) {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)&pHVar5->pFileFlag + lVar7) = 0;
      lVar7 = lVar7 + 0x2c04d0;
    } while ((ulong)(uint)maxLoadedFiles * 0x2c04d0 - lVar7 != 0);
  }
  paFVar10 = this->hgtFilesGrid;
  local_58 = 0;
  local_60 = this;
  do {
    local_48 = (double)(0x5a - (int)local_58);
    iVar8 = -0xb4;
    lVar7 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,local_50,local_3c);
      HgtFormat::crdtodem(local_48,(double)iVar8,(char *)local_3c);
      std::__cxx11::string::append((char *)&local_80);
      __stream = fopen((char *)local_80,"rb");
      if (__stream == (FILE *)0x0) {
        *(undefined8 *)((long)&(*paFVar10)[0].fileName + lVar7) = 0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"loaded: ",8);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_80,CONCAT44(uStack_74,local_78));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        __dest = (char *)operator_new__((long)(local_78 + 1));
        *(char **)((long)&(*paFVar10)[0].fileName + lVar7) = __dest;
        strcpy(__dest,(char *)local_80);
        fclose(__stream);
      }
      *(undefined8 *)((long)&(*paFVar10)[0].pHeightData + lVar7) = 0;
      (&(*paFVar10)[0].isLoaded)[lVar7] = false;
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      iVar8 = iVar8 + 1;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x21d8);
    local_58 = local_58 + 1;
    paFVar10 = paFVar10 + 1;
  } while (local_58 != 0xb5);
  lVar7 = 0x21d0;
  do {
    *(undefined8 *)((long)&local_60->hgtFilesGrid[0][0].fileName + lVar7) =
         *(undefined8 *)((long)local_60 + lVar7 + -0x21b0);
    puVar2 = (undefined8 *)((long)local_60 + lVar7 + -0x21c0);
    uVar4 = puVar2[1];
    puVar1 = (undefined8 *)((long)(local_60->hgtFilesGrid + -1) + 0x21c8 + lVar7);
    *puVar1 = *puVar2;
    puVar1[1] = uVar4;
    lVar7 = lVar7 + 0x21d8;
  } while (lVar7 != 0x180f88);
  return;
}

Assistant:

void HgtFilesGrid::Init( int maxLoadedFiles, const char* filesPath )
{
	this->loadedFiles = 0;
	this->MAX_LOADED_FILES = maxLoadedFiles;
	this->dataStack = new Heights[maxLoadedFiles];
	for( int i = 0; i < maxLoadedFiles; i++ )
		this->dataStack[i].pFileFlag = NULL;

	for( int i = 0; i <= 180; i++ ){
		for( int j = 0; j <= 360; j++ ){
			FILE *fp;
			std::string fileName(filesPath);
			char demFileName[12];
			fileName.append(HgtFormat::crdtodem(90 - i, -180 + j, demFileName));
            fp = fopen(fileName.c_str(), "rb");
            
			if( fp == NULL ) {
				
				this->hgtFilesGrid[i][j].fileName = NULL;
			} else {
				std::cout << "loaded: " << fileName << "\n";
				int length = fileName.length();
				this->hgtFilesGrid[i][j].fileName = new char[length + 1];
                strcpy(hgtFilesGrid[i][j].fileName, fileName.c_str());
                
				//strcpy_s( hgtFilesGrid[i][j].fileName, length + 1, fileName.c_str() );
				fclose(fp);
			}
			this->hgtFilesGrid[i][j].pHeightData = NULL;
			this->hgtFilesGrid[i][j].isLoaded = false;
		}
	}

	for( int i = 0; i <= 180; i++ ){
		this->hgtFilesGrid[i][360] = this->hgtFilesGrid[i][0];
	}
}